

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_string_op(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  
  TVar1 = lj_ir_tostr(J,*J->base);
  TVar2 = lj_ir_kptr_(J,IR_KPTR,&J[-1].penalty[0x2f].val);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55090000;
  TVar2 = lj_opt_fold(J);
  TVar1 = lj_ir_call(J,rd->data,(ulong)TVar2,(ulong)TVar1);
  (J->fold).ins.field_0.ot = 0x5784;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar1 = lj_opt_fold(J);
  *J->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_op(jit_State *J, RecordFFData *rd)
{
  TRef str = lj_ir_tostr(J, J->base[0]);
  TRef hdr = recff_bufhdr(J);
  TRef tr = lj_ir_call(J, rd->data, hdr, str);
  J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
}